

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGLSLnoperspectiveTests.cpp
# Opt level: O0

GLuint gl3cts::prepare_shader(Context *context,GLenum stage,GLchar *code)

{
  int iVar1;
  GLuint shader_id;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  exception *exc;
  GLuint id;
  Functions *gl;
  GLchar *code_local;
  GLenum stage_local;
  Context *context_local;
  
  pRVar2 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  shader_id = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x3f0))(stage);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x6a);
  compile_shader(context,shader_id,code);
  return shader_id;
}

Assistant:

glw::GLuint prepare_shader(deqp::Context& context, glw::GLenum stage, const glw::GLchar* code)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Compilation status */
	glw::GLuint id = 0;

	/* Create */
	id = gl.createShader(stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	try
	{
		compile_shader(context, id, code);
	}
	catch (const std::exception& exc)
	{
		gl.deleteShader(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteShader");

		TCU_FAIL(exc.what());
	}

	return id;
}